

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dog.c
# Opt level: O1

void wary_dog(monst *mtmp,boolean was_dead)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  
  mtmp->meating = 0;
  cVar1 = mtmp->mtame;
  if ((long)cVar1 == 0) {
    return;
  }
  uVar2 = *(uint *)&mtmp->field_0x60;
  puVar4 = (undefined8 *)&mtmp->field_0x74;
  puVar5 = (undefined8 *)0x0;
  if ((uVar2 & 0x4000000) == 0) {
    iVar3 = *(int *)&mtmp[1].minvent;
    if (iVar3 != 0) {
      mtmp->mhpmax = mtmp->mhpmax + iVar3;
      mtmp->mhp = mtmp->mhp + iVar3;
      *(undefined4 *)&mtmp[1].minvent = 0;
    }
    if ((((ulong)mtmp[1].minvent & 0x1000000000000) != 0) ||
       (puVar5 = puVar4, 2 < *(int *)&mtmp[1].dlevel)) {
      mtmp->mtame = '\0';
      mtmp->field_0x62 = mtmp->field_0x62 & 0xbf;
      uVar7 = *(uint *)&mtmp[1].dlevel;
      if ((uVar7 < 10) && (uVar6 = mt_random(), uVar6 % (uVar7 + 1) == 0)) {
        mtmp->field_0x62 = mtmp->field_0x62 | 0x40;
      }
      if (((was_dead == '\0') && ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0)) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)) {
        uVar7 = mtmp->data->mflags1;
        pcVar8 = Monnam(mtmp);
        if ((uVar7 >> 0xc & 1) == 0) {
          pcVar10 = "seems unable";
          if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
            pcVar10 = "refuses";
          }
          pcVar9 = body_part(1);
          pline("%s %s to look you in the %s.",pcVar8,pcVar10,pcVar9);
        }
        else {
          pline("%s avoids your gaze.",pcVar8);
        }
      }
      goto LAB_00174037;
    }
  }
  puVar4 = puVar5;
  uVar7 = mt_random();
  if (SUB168(ZEXT416(uVar7) % SEXT816((long)cVar1),0) == 0) {
    mtmp->mtame = '\0';
    mtmp->field_0x62 = mtmp->field_0x62 & 0xbf;
  }
LAB_00174037:
  if ((mtmp->mtame == '\0') && (newsym((int)mtmp->mx,(int)mtmp->my), (mtmp->field_0x63 & 1) != 0)) {
    m_unleash(mtmp,'\x01');
  }
  if (((uVar2 >> 0x1a & 1) == 0) && (mtmp->mtame != '\0')) {
    *(int *)(puVar4 + 3) = *(int *)(puVar4 + 3) + 1;
    *(byte *)((long)puVar4 + 0x22) = *(byte *)((long)puVar4 + 0x22) & 0xfe;
    *(undefined4 *)((long)puVar4 + 0x14) = 0;
    *(undefined2 *)(puVar4 + 4) = 0xffff;
    if ((was_dead != '\0') || ((ulong)*(uint *)(puVar4 + 2) < (ulong)moves + 500)) {
      *(uint *)(puVar4 + 2) = moves + 500;
    }
    if (was_dead != '\0') {
      *puVar4 = 0x271000000000;
      puVar4[1] = 5;
    }
  }
  return;
}

Assistant:

void wary_dog(struct monst *mtmp, boolean was_dead)
{
    struct edog *edog;
    boolean quietly = was_dead;

    mtmp->meating = 0;
    if (!mtmp->mtame) return;
    edog = !mtmp->isminion ? EDOG(mtmp) : 0;

    /* if monster was starving when it died, undo that now */
    if (edog && edog->mhpmax_penalty) {
	mtmp->mhpmax += edog->mhpmax_penalty;
	mtmp->mhp += edog->mhpmax_penalty;	/* heal it */
	edog->mhpmax_penalty = 0;
    }

    if (edog && (edog->killed_by_u == 1 || edog->abuse > 2)) {
	mtmp->mpeaceful = mtmp->mtame = 0;
	if (edog->abuse >= 0 && edog->abuse < 10)
	    if (!rn2(edog->abuse + 1)) mtmp->mpeaceful = 1;
	if (!quietly && cansee(mtmp->mx, mtmp->my)) {
	    if (haseyes(youmonst.data)) {
		if (haseyes(mtmp->data))
			pline("%s %s to look you in the %s.",
				Monnam(mtmp),
				mtmp->mpeaceful ? "seems unable" :
					    "refuses",
				body_part(EYE));
		else 
			pline("%s avoids your gaze.",
				Monnam(mtmp));
	    }
	}
    } else {
	/* chance it goes wild anyway - Pet Semetary */
	if (!rn2(mtmp->mtame)) {
	    mtmp->mpeaceful = mtmp->mtame = 0;
	}
    }
    if (!mtmp->mtame) {
	newsym(mtmp->mx, mtmp->my);
	/* a life-saved monster might be leashed;
	   don't leave it that way if it's no longer tame */
	if (mtmp->mleashed) m_unleash(mtmp, TRUE);
    }

    /* if its still a pet, start a clean pet-slate now */
    if (edog && mtmp->mtame) {
	edog->revivals++;
	edog->killed_by_u = 0;
	edog->abuse = 0;
	edog->ogoal.x = edog->ogoal.y = -1;
	if (was_dead || edog->hungrytime < moves + 500L)
	    edog->hungrytime = moves + 500L;
	if (was_dead) {
	    edog->droptime = 0L;
	    edog->dropdist = 10000;
	    edog->whistletime = 0L;
	    edog->apport = 5;
	} /* else lifesaved, so retain current values */
    }
}